

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Args.cpp
# Opt level: O1

int __thiscall cali::util::Args::ArgsImpl::parse(ArgsImpl *this,int argc,char **argv,int pos)

{
  uint uVar1;
  undefined1 uVar2;
  char *pcVar3;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *this_00;
  int iVar4;
  long lVar5;
  iterator iVar6;
  ulong uVar7;
  _Base_ptr p_Var8;
  _Base_ptr p_Var9;
  char *pcVar10;
  ulong uVar11;
  char **__args;
  string optarg;
  string arg;
  int local_e0;
  allocator<char> local_d9;
  undefined1 *local_d8;
  long local_d0;
  undefined1 local_c8;
  undefined7 uStack_c7;
  ArgsImpl *local_b8;
  undefined1 local_b0 [8];
  _Alloc_hider local_a8;
  undefined1 local_a0 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_68;
  _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::__cxx11::string>,std::_Select1st<std::pair<unsigned_long_const,std::__cxx11::string>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::__cxx11::string>>>
  *local_60;
  ulong local_58;
  _Base_ptr local_50;
  _Base_ptr local_48;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *local_40;
  ulong local_38;
  
  iVar4 = pos;
  if (pos < argc) {
    pcVar3 = *argv;
    pcVar10 = (char *)(this->m_programname)._M_string_length;
    strlen(pcVar3);
    std::__cxx11::string::_M_replace((ulong)&this->m_programname,0,pcVar10,(ulong)pcVar3);
    local_40 = &this->m_long_options;
    local_48 = &(this->m_long_options)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_60 = (_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::__cxx11::string>,std::_Select1st<std::pair<unsigned_long_const,std::__cxx11::string>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::__cxx11::string>>>
                *)&this->m_active_options;
    local_50 = &(this->m_short_options)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_68 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &this->m_arguments;
    local_b8 = this;
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_88,argv[pos],(allocator<char> *)local_b0);
      local_e0 = 4;
      if (local_88._M_string_length != 0) {
        if ((local_88._M_string_length == (local_b8->m_options_end)._M_string_length) &&
           (iVar4 = bcmp(local_88._M_dataplus._M_p,(local_b8->m_options_end)._M_dataplus._M_p,
                         local_88._M_string_length), iVar4 == 0)) {
          local_e0 = 2;
        }
        else if (((local_b8->m_longopt_prefix)._M_string_length == 0) ||
                (lVar5 = std::__cxx11::string::find
                                   ((char *)&local_88,
                                    (ulong)(local_b8->m_longopt_prefix)._M_dataplus._M_p,0),
                lVar5 != 0)) {
          uVar11 = (local_b8->m_shortopt_prefix)._M_string_length;
          if ((uVar11 == 0) ||
             (lVar5 = std::__cxx11::string::find
                                ((char *)&local_88,
                                 (ulong)(local_b8->m_shortopt_prefix)._M_dataplus._M_p,0),
             lVar5 != 0)) {
            local_e0 = 0;
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string&>(local_68,&local_88);
          }
          else {
            uVar7 = std::__cxx11::string::find((char)&local_88,0x3d);
            if (uVar11 < uVar7 && uVar11 < local_88._M_string_length) {
              local_58 = uVar7 + 1;
              local_38 = uVar7 - 1;
              while( true ) {
                p_Var9 = (local_b8->m_short_options)._M_t._M_impl.super__Rb_tree_header._M_header.
                         _M_parent;
                p_Var8 = local_50;
                if (p_Var9 != (_Base_ptr)0x0) {
                  do {
                    uVar2 = (undefined1)p_Var9[1]._M_color;
                    if (local_88._M_dataplus._M_p[uVar11] <= (char)uVar2) {
                      p_Var8 = p_Var9;
                    }
                    p_Var9 = (&p_Var9->_M_left)[(char)uVar2 < local_88._M_dataplus._M_p[uVar11]];
                  } while (p_Var9 != (_Base_ptr)0x0);
                }
                p_Var9 = local_50;
                if ((p_Var8 != local_50) &&
                   (p_Var9 = p_Var8, local_88._M_dataplus._M_p[uVar11] < (char)p_Var8[1]._M_color))
                {
                  p_Var9 = local_50;
                }
                if (p_Var9 == local_50) {
                  pcVar10 = (char *)(ulong)(uint)pos;
                }
                else {
                  local_d8 = &local_c8;
                  local_d0 = 0;
                  local_c8 = 0;
                  if (uVar11 == local_38 && local_58 < local_88._M_string_length) {
                    std::__cxx11::string::assign((string *)&local_d8,(ulong)&local_88,local_58);
                  }
                  if (((uVar11 == local_88._M_string_length - 1) &&
                      ((local_b8->m_options).
                       super__Vector_base<cali::util::Args::Table,_std::allocator<cali::util::Args::Table>_>
                       ._M_impl.super__Vector_impl_data._M_start[(long)p_Var9[1]._M_parent].
                       has_argument == true)) && (uVar1 = pos + 1, (int)uVar1 < argc)) {
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)local_b0,argv[(int)uVar1],&local_d9);
                    std::__cxx11::string::operator=((string *)&local_d8,(string *)local_b0);
                    pos = uVar1;
                    if (local_b0 != (undefined1  [8])local_a0) {
                      operator_delete((void *)local_b0,local_a0._0_8_ + 1);
                    }
                  }
                  local_b0 = (undefined1  [8])p_Var9[1]._M_parent;
                  local_a8._M_p = local_a0 + 8;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_a8,local_d8,local_d8 + local_d0);
                  std::
                  _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::__cxx11::string>,std::_Select1st<std::pair<unsigned_long_const,std::__cxx11::string>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::__cxx11::string>>>
                  ::_M_emplace_unique<std::pair<unsigned_long,std::__cxx11::string>>
                            (local_60,(pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       *)local_b0);
                  if (local_a8._M_p != local_a0 + 8) {
                    operator_delete(local_a8._M_p,local_a0._8_8_ + 1);
                  }
                  if (local_d8 != &local_c8) {
                    operator_delete(local_d8,CONCAT71(uStack_c7,local_c8) + 1);
                  }
                }
                if (p_Var9 == local_50) break;
                uVar11 = uVar11 + 1;
                if ((uVar7 <= uVar11) || (local_88._M_string_length <= uVar11)) goto LAB_00112207;
              }
              local_e0 = 1;
            }
          }
        }
        else {
          lVar5 = std::__cxx11::string::find((char)&local_88,0x3d);
          std::__cxx11::string::substr((ulong)local_b0,(ulong)&local_88);
          iVar6 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                  ::find(&local_40->_M_t,(key_type *)local_b0);
          if (local_b0 != (undefined1  [8])local_a0) {
            operator_delete((void *)local_b0,local_a0._0_8_ + 1);
          }
          if (iVar6._M_node == local_48) {
            local_e0 = 1;
            pcVar10 = (char *)(ulong)(uint)pos;
          }
          else {
            local_d8 = &local_c8;
            local_d0 = 0;
            local_c8 = 0;
            if ((lVar5 != -1) && (lVar5 + 1U < local_88._M_string_length)) {
              std::__cxx11::string::assign((string *)&local_d8,(ulong)&local_88,lVar5 + 1U);
            }
            if ((((local_b8->m_options).
                  super__Vector_base<cali::util::Args::Table,_std::allocator<cali::util::Args::Table>_>
                  ._M_impl.super__Vector_impl_data._M_start[*(long *)(iVar6._M_node + 2)].
                  has_argument == true) && (local_d0 == 0)) && (uVar1 = pos + 1, (int)uVar1 < argc))
            {
              pcVar3 = argv[(int)uVar1];
              strlen(pcVar3);
              std::__cxx11::string::_M_replace((ulong)&local_d8,0,(char *)0x0,(ulong)pcVar3);
              pos = uVar1;
            }
            local_b0 = *(undefined1 (*) [8])(iVar6._M_node + 2);
            local_a8._M_p = local_a0 + 8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_a8,local_d8,local_d8 + local_d0);
            std::
            _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::__cxx11::string>,std::_Select1st<std::pair<unsigned_long_const,std::__cxx11::string>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::__cxx11::string>>>
            ::_M_emplace_unique<std::pair<unsigned_long,std::__cxx11::string>>
                      (local_60,(pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)local_b0);
            if (local_a8._M_p != local_a0 + 8) {
              operator_delete(local_a8._M_p,local_a0._8_8_ + 1);
            }
            if (local_d8 != &local_c8) {
              operator_delete(local_d8,CONCAT71(uStack_c7,local_c8) + 1);
            }
          }
        }
      }
LAB_00112207:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      this_00 = local_68;
      if ((local_e0 != 0) && (local_e0 != 4)) {
        if (local_e0 != 2) {
          return (int)pcVar10;
        }
        break;
      }
      pos = pos + 1;
    } while (pos < argc);
    iVar4 = pos + 1;
    if (iVar4 < argc) {
      __args = argv + pos;
      do {
        __args = __args + 1;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const*const&>(this_00,__args);
        iVar4 = iVar4 + 1;
      } while (argc != iVar4);
    }
  }
  return iVar4;
}

Assistant:

int parse(int argc, const char* const argv[], int pos)
    {
        if (argc <= pos)
            return pos;

        m_programname = argv[0];

        int i;

        for (i = pos; i < argc; ++i) {
            std::string arg { argv[i] };

            if (arg.empty())
                continue;
            if (arg == m_options_end)
                break;

            // --- handle long options

            auto lps = m_longopt_prefix.size();

            if (!m_longopt_prefix.empty() && arg.find(m_longopt_prefix) == 0) {
                std::string::size_type dpos = arg.find('=');

                auto it = m_long_options.find(arg.substr(lps, dpos == std::string::npos ? dpos : dpos - lps));

                if (it == m_long_options.end())
                    return i;

                std::string optarg;

                if (dpos != std::string::npos && dpos + 1 < arg.size())
                    optarg.assign(arg, dpos + 1, std::string::npos);
                if (m_options[it->second].has_argument && optarg.empty() && i + 1 < argc)
                    optarg.assign(argv[++i]);

                m_active_options.insert(make_pair(it->second, optarg));

                continue;
            }

            // handle short options

            auto sps = m_shortopt_prefix.size();

            if (!m_shortopt_prefix.empty() && arg.find(m_shortopt_prefix) == 0) {
                std::string::size_type dpos = arg.find('=');

                // handle characters in the shortopt string; last one may have an option argument
                for (auto n = sps; n < arg.size() && n < dpos; ++n) {
                    auto it = m_short_options.find(arg[n]);

                    if (it == m_short_options.end())
                        return i;

                    std::string optarg;

                    if (dpos + 1 < arg.size() && n == dpos - 1)
                        optarg.assign(arg, dpos + 1, std::string::npos);
                    if (n == arg.size() - 1 && m_options[it->second].has_argument && (i + 1) < argc)
                        optarg.assign(std::string(argv[++i]));

                    m_active_options.insert(make_pair(it->second, optarg));
                }

                continue;
            }

            // this is a non-option argument
            m_arguments.emplace_back(arg);
        }

        // treat all remaining elements as arguments (i.e., not options)

        for (++i; i < argc; ++i)
            m_arguments.emplace_back(argv[i]);

        return i;
    }